

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O1

bool __thiscall Js::JavascriptMap::DeleteFromVarMap<false>(JavascriptMap *this,Var value)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Var local_28;
  Var value_local;
  MapDataNode *node;
  
  local_28 = value;
  if (this->kind != SimpleVarMap) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x15f,
                                "(this->kind == (isComplex ? MapKind::ComplexVarMap : MapKind::SimpleVarMap))"
                                ,
                                "this->kind == (isComplex ? MapKind::ComplexVarMap : MapKind::SimpleVarMap)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  value_local = (Var)0x0;
  bVar2 = JsUtil::
          BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValueAndRemove
                    ((BaseDictionary<void_*,_Js::MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                      *)this->u,&local_28,
                     (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                      **)&value_local);
  if (bVar2) {
    MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
    ::Remove(&this->list,
             (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
              *)value_local);
  }
  return bVar2;
}

Assistant:

bool
JavascriptMap::DeleteFromVarMap(Var value)
{
    Assert(this->kind == (isComplex ? MapKind::ComplexVarMap : MapKind::SimpleVarMap));

    MapDataNode * node = nullptr;
    if (isComplex
        ? !this->u.complexVarMap->TryGetValueAndRemove(value, &node)
        : !this->u.simpleVarMap->TryGetValueAndRemove(value, &node))
    {
        return false;
    }

    this->list.Remove(node);
    return true;
}